

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sounds.cpp
# Opt level: O2

void __thiscall CSounds::Enqueue(CSounds *this,int Channel,int SetId)

{
  int iVar1;
  CGameClient *pCVar2;
  long lVar3;
  
  pCVar2 = (this->super_CComponent).m_pClient;
  if (pCVar2->m_SuppressEvents == false) {
    iVar1 = this->m_QueuePos;
    lVar3 = (long)iVar1;
    if ((lVar3 < 0x20) && ((Channel == 1 || (pCVar2->m_pConfig->m_ClEditor == 0)))) {
      this->m_aQueue[lVar3].m_Channel = Channel;
      this->m_QueuePos = iVar1 + 1;
      this->m_aQueue[lVar3].m_SetId = SetId;
      return;
    }
  }
  return;
}

Assistant:

void CSounds::Enqueue(int Channel, int SetId)
{
	if(m_pClient->m_SuppressEvents)
		return;
	if(m_QueuePos >= QUEUE_SIZE)
		return;
	if(Channel != CHN_MUSIC && Config()->m_ClEditor)
		return;

	m_aQueue[m_QueuePos].m_Channel = Channel;
	m_aQueue[m_QueuePos++].m_SetId = SetId;
}